

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O1

void __thiscall xmrig::SelfSelectClient::getBlockTemplate(SelfSelectClient *this)

{
  long lVar1;
  int __flags;
  Value params;
  Document doc;
  Data local_a8;
  String local_98;
  Data local_88;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_70;
  
  if (this->m_state != WaitState) {
    lVar1 = std::chrono::_V2::steady_clock::now();
    this->m_timestamp = lVar1 / 1000000;
    this->m_state = WaitState;
  }
  __flags = 0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&local_70,kObjectType,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_a8.n = (Number)0x0;
  local_a8.s.str = (Ch *)0x3000000000000;
  String::toJSON(&local_98);
  local_88.s.str = (Ch *)0x40500000018d642;
  local_88.n = (Number)0xe;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98,local_70.allocator_);
  String::toJSON(&local_98);
  local_88.s.str = (Ch *)0x40500000018b5f0;
  local_88.n = (Number)0xb;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98,local_70.allocator_);
  lVar1 = this->m_sequence;
  this->m_sequence = lVar1 + 1;
  JsonRequest::create(&local_70,lVar1,"getblocktemplate",(Value *)&local_a8.s);
  send(this,3,"/json_rpc",(size_t)&local_70,__flags);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&local_70);
  return;
}

Assistant:

void xmrig::SelfSelectClient::getBlockTemplate()
{
    setState(WaitState);

    using namespace rapidjson;
    Document doc(kObjectType);
    auto &allocator = doc.GetAllocator();

    Value params(kObjectType);
    params.AddMember("wallet_address",  m_job.poolWallet().toJSON(), allocator);
    params.AddMember("extra_nonce",     m_job.extraNonce().toJSON(), allocator);

    JsonRequest::create(doc, m_sequence++, "getblocktemplate", params);

    send(HTTP_POST, "/json_rpc", doc);
}